

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-oid.c
# Opt level: O2

void test_bson_oid_init_sequence_with_tid(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  bson_oid_t oid2;
  bson_oid_t oid;
  
  uVar3 = bson_context_new(8);
  bson_oid_init_sequence(&oid,uVar3);
  iVar4 = 10000;
  while( true ) {
    bVar6 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar6) {
      bson_context_destroy(uVar3);
      return;
    }
    bson_oid_init_sequence(&oid2,uVar3);
    cVar1 = bson_oid_equal(&oid,&oid2);
    if (cVar1 != '\0') break;
    iVar2 = bson_oid_compare(&oid,&oid2);
    if (-1 < iVar2) {
      pcVar5 = "0 > bson_oid_compare (&oid, &oid2)";
      uVar3 = 0x105;
      goto LAB_00129828;
    }
    bson_oid_copy(&oid2,&oid);
  }
  pcVar5 = "false == bson_oid_equal (&oid, &oid2)";
  uVar3 = 0x104;
LAB_00129828:
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-oid.c",
          uVar3,"test_bson_oid_init_sequence_with_tid",pcVar5);
  abort();
}

Assistant:

static void
test_bson_oid_init_sequence_with_tid (void)
{
   bson_context_t *context;
   bson_oid_t oid;
   bson_oid_t oid2;
   int i;

   context = bson_context_new (BSON_CONTEXT_USE_TASK_ID);
   bson_oid_init_sequence (&oid, context);
   for (i = 0; i < 10000; i++) {
      bson_oid_init_sequence (&oid2, context);
      BSON_ASSERT (false == bson_oid_equal (&oid, &oid2));
      BSON_ASSERT (0 > bson_oid_compare (&oid, &oid2));
      bson_oid_copy (&oid2, &oid);
   }
   bson_context_destroy (context);
}